

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

void __thiscall Clasp::DefaultUnfoundedCheck::createLoopFormula(DefaultUnfoundedCheck *this)

{
  uint32 nAtoms;
  Literal *atoms;
  pointer pAVar1;
  ClauseHead *c;
  size_type sVar2;
  ulong uVar3;
  pointer pLVar4;
  uint uVar5;
  Result RVar6;
  ClauseRep local_20;
  
  atoms = (this->loopAtoms_).ebo_.buf;
  local_20.lits = (this->activeClause_).ebo_.buf;
  (local_20.lits)->rep_ = atoms->rep_;
  nAtoms = (this->loopAtoms_).ebo_.size;
  if (nAtoms == 1) {
    RVar6 = ClauseCreator::create(this->solver_,&this->activeClause_,0x80,&this->info_);
    c = RVar6.local;
  }
  else {
    local_20._0_8_ =
         CONCAT44((this->activeClause_).ebo_.size,(this->info_).super_ConstraintScore.rep) |
         0x8000000000000000;
    c = (ClauseHead *)LoopFormula::newLoopFormula(this->solver_,&local_20,atoms,nAtoms,true);
    Solver::addLearnt(this->solver_,(Constraint *)c,
                      (this->activeClause_).ebo_.size + (this->loopAtoms_).ebo_.size,Loop);
  }
  pAVar1 = (this->solver_->assign_).reason_.super_type.ebo_.buf;
  uVar3 = (ulong)((this->loopAtoms_).ebo_.size - 1);
  pLVar4 = (this->loopAtoms_).ebo_.buf + uVar3;
  do {
    uVar5 = pLVar4->rep_ >> 2;
    if ((ClauseHead *)pAVar1[uVar5].data_ != c) {
      pAVar1[uVar5].data_ = (uint64)c;
    }
    sVar2 = (size_type)uVar3;
    (this->loopAtoms_).ebo_.size = sVar2;
    pLVar4 = pLVar4 + -1;
    uVar3 = (ulong)(sVar2 - 1);
  } while (sVar2 != 0);
  return;
}

Assistant:

void DefaultUnfoundedCheck::createLoopFormula() {
	assert(activeClause_.size() > 3 && !loopAtoms_.empty());
	Antecedent ante;
	activeClause_[0] = loopAtoms_[0];
	if (loopAtoms_.size() == 1) {
		ante = ClauseCreator::create(*solver_, activeClause_, ClauseCreator::clause_no_prepare, info_).local;
	}
	else {
		assert(!info_.tagged() && !info_.aux());
		ante = LoopFormula::newLoopFormula(*solver_
			, ClauseRep::prepared(&activeClause_[0], (uint32)activeClause_.size(), info_)
			, &loopAtoms_[0], (uint32)loopAtoms_.size());
		solver_->addLearnt(ante.constraint(), uint32(loopAtoms_.size() + activeClause_.size()), Constraint_t::Loop);
	}
	do {
		Literal p = loopAtoms_.back();
		assert(solver_->isTrue(p));
		if (solver_->reason(p).asUint() != ante.asUint()) {
			assert(solver_->reason(p) == this);
			solver_->setReason(p, ante);
		}
		loopAtoms_.pop_back();
	} while (!loopAtoms_.empty());
}